

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O2

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::initialize(DepthBiasBaseCase *this)

{
  Move<vk::Handle<(vk::HandleType)16>_> *this_00;
  Move<vk::Handle<(vk::HandleType)13>_> *this_01;
  Move<vk::Handle<(vk::HandleType)13>_> *this_02;
  Move<vk::Handle<(vk::HandleType)17>_> *this_03;
  DeviceInterface *pDVar1;
  VkImage VVar2;
  Allocation *pAVar3;
  VkAllocationCallbacks *__dest;
  Buffer *pBVar4;
  VkAttachmentDescription attachment;
  VkAttachmentDescription attachment_00;
  VkSubpassDescription subpass;
  deUint32 _queueFamilyIndex;
  VkDevice pVVar5;
  InstanceInterface *pIVar6;
  VkPhysicalDevice pVVar7;
  ProgramBinary *pPVar8;
  Allocator *pAVar9;
  NotSupportedError *this_04;
  long lVar10;
  VkFormat VVar11;
  PipelineCreateInfo *pPVar12;
  undefined8 *puVar13;
  VkDeviceSize __n;
  byte bVar14;
  VkExtent3D _extent;
  VkExtent3D _extent_00;
  VkAttachmentReference *_colorAttachments;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 in_stack_fffffffffffff824;
  undefined8 uVar24;
  undefined4 uVar25;
  undefined4 in_stack_fffffffffffff834;
  undefined4 uVar26;
  undefined4 in_stack_fffffffffffff83c;
  undefined1 local_7b8 [8];
  VkDeviceMemory VStack_7b0;
  Handle<(vk::HandleType)8> local_7a8;
  VkCommandPool VStack_7a0;
  Handle<(vk::HandleType)17> local_798;
  VkDeviceMemory VStack_790;
  VkDevice local_788;
  VkShaderModule VStack_780;
  undefined1 local_778 [24];
  _Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  local_760 [2];
  VkDevice local_730;
  FramebufferCreateInfo framebufferCreateInfo;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachments;
  _Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_6c8;
  _Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_6b0;
  VkFormatProperties formatProperties;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_688;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_668;
  RenderPassCreateInfo renderPassCreateInfo;
  VkAttachmentReference colorAttachmentReference;
  PipelineCreateInfo pipelineCreateInfo;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  Attachment vkCbAttachmentState;
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  ImageCreateInfo depthStencilImageCreateInfo;
  ImageCreateInfo targetImageCreateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  ImageViewCreateInfo attachmentViewInfo;
  ImageViewCreateInfo colorTargetViewInfo;
  
  bVar14 = 0;
  pVVar5 = Context::getDevice((this->super_TestInstance).m_context);
  pIVar6 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar7 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  VVar11 = VK_FORMAT_D24_UNORM_S8_UINT;
  (*pIVar6->_vptr_InstanceInterface[3])(pIVar6,pVVar7,0x81);
  if ((formatProperties.optimalTilingFeatures._1_1_ & 2) == 0) {
    pIVar6 = Context::getInstanceInterface((this->super_TestInstance).m_context);
    pVVar7 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    VVar11 = VK_FORMAT_D32_SFLOAT_S8_UINT;
    (*pIVar6->_vptr_InstanceInterface[3])(pIVar6,pVVar7,0x82);
    if ((formatProperties.optimalTilingFeatures._1_1_ & 2) == 0) {
      this_04 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pipelineCreateInfo,"No valid depth stencil attachment available",
                 (allocator<char> *)&renderPassCreateInfo);
      tcu::NotSupportedError::NotSupportedError(this_04,(string *)&pipelineCreateInfo);
      __cxa_throw(this_04,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this->m_depthStencilAttachmentFormat = VVar11;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            (&pipelineLayoutCreateInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&pipelineCreateInfo,0,(VkPushConstantRange *)0x0);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                 *)&pipelineCreateInfo);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&renderPassCreateInfo,this->m_vk,pVVar5,
             &pipelineLayoutCreateInfo.super_VkPipelineLayoutCreateInfo,(VkAllocationCallbacks *)0x0
            );
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.flags;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.sType;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  this_00 = &this->m_pipelineLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&renderPassCreateInfo);
  pDVar1 = this->m_vk;
  pPVar8 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (((this->super_TestInstance).m_context)->m_progCollection,
                      &this->m_vertexShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar1,pVVar5,pPVar8,0);
  local_668.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  local_668.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_668.m_data.object.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  local_668.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo);
  pDVar1 = this->m_vk;
  pPVar8 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (((this->super_TestInstance).m_context)->m_progCollection,
                      &this->m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar1,pVVar5,pPVar8,0);
  local_688.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  local_688.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_688.m_data.object.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  local_688.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  local_730 = (VkDevice)this_00;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo);
  _extent.depth = 1;
  _extent.width = 0x80;
  _extent.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&targetImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x13,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pDVar1 = this->m_vk;
  pAVar9 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Image::createAndAlloc
            ((Image *)&pipelineCreateInfo,pDVar1,pVVar5,
             &targetImageCreateInfo.super_VkImageCreateInfo,pAVar9,(MemoryRequirement)0x0);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_colorTargetImage,(SharedPtr<vkt::Draw::Image> *)&pipelineCreateInfo);
  de::SharedPtr<vkt::Draw::Image>::release((SharedPtr<vkt::Draw::Image> *)&pipelineCreateInfo);
  uVar26 = 0;
  uVar25 = 0;
  uVar24 = 0;
  uVar23 = 0;
  _extent_00.depth = 1;
  _extent_00.width = 0x80;
  _extent_00.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&depthStencilImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_depthStencilAttachmentFormat,
             _extent_00,1,1,VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x22,
             VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pDVar1 = this->m_vk;
  pAVar9 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Image::createAndAlloc
            ((Image *)&pipelineCreateInfo,pDVar1,pVVar5,
             &depthStencilImageCreateInfo.super_VkImageCreateInfo,pAVar9,(MemoryRequirement)0x0);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_depthStencilImage,(SharedPtr<vkt::Draw::Image> *)&pipelineCreateInfo);
  de::SharedPtr<vkt::Draw::Image>::release((SharedPtr<vkt::Draw::Image> *)&pipelineCreateInfo);
  VVar2.m_internal =
       (((this->m_colorTargetImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
       m_data.object.m_internal;
  VVar11 = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&pipelineCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&colorTargetViewInfo,VVar2,VK_IMAGE_VIEW_TYPE_2D,VVar11,
             (VkComponentMapping *)&pipelineCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&renderPassCreateInfo,this->m_vk,pVVar5,
             &colorTargetViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.flags;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.sType;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  this_01 = &this->m_colorTargetView;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)
                pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&renderPassCreateInfo);
  VVar2.m_internal =
       (((this->m_depthStencilImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>
       .m_data.object.m_internal;
  VVar11 = this->m_depthStencilAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&pipelineCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&attachmentViewInfo,VVar2,VK_IMAGE_VIEW_TYPE_2D,VVar11,
             (VkComponentMapping *)&pipelineCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&renderPassCreateInfo,this->m_vk,pVVar5,
             &attachmentViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.flags;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.sType;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  this_02 = &this->m_attachmentView;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&renderPassCreateInfo);
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            (&renderPassCreateInfo,0,(VkAttachmentDescription *)0x0,0,(VkSubpassDescription *)0x0,0,
             (VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&pipelineCreateInfo,this->m_colorAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_GENERAL);
  attachment.samples = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  attachment.flags = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
  attachment.format = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
  attachment.loadOp =
       (int)((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext >> 0x20);
  attachment.storeOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
  attachment.stencilLoadOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
  attachment.stencilStoreOp = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  attachment.initialLayout =
       (int)((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages >> 0x20);
  attachment.finalLayout =
       (VkImageLayout)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState;
  Draw::RenderPassCreateInfo::addAttachment(&renderPassCreateInfo,attachment);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&pipelineCreateInfo,this->m_depthStencilAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  uVar20 = (undefined4)
           ((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages >> 0x20);
  attachment_00.samples = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  attachment_00.flags = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
  attachment_00.format = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
  attachment_00.loadOp =
       (int)((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext >> 0x20);
  attachment_00.storeOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
  attachment_00.stencilLoadOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
  attachment_00.stencilStoreOp = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  attachment_00.initialLayout = uVar20;
  attachment_00.finalLayout =
       (VkImageLayout)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState;
  Draw::RenderPassCreateInfo::addAttachment(&renderPassCreateInfo,attachment_00);
  _colorAttachments = &colorAttachmentReference;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  uVar21 = 0;
  uVar22 = 0;
  uVar17 = 1;
  uVar18 = 3;
  uVar19 = 0;
  uVar15 = 0;
  uVar16 = 0;
  Draw::SubpassDescription::SubpassDescription
            ((SubpassDescription *)&pipelineCreateInfo,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,
             (VkAttachmentReference *)0x0,1,_colorAttachments,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)0x300000001,0,(deUint32 *)0x0);
  pPVar12 = &pipelineCreateInfo;
  puVar13 = (undefined8 *)&stack0xfffffffffffff7f8;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar13 = *(undefined8 *)&pPVar12->super_VkGraphicsPipelineCreateInfo;
    pPVar12 = (PipelineCreateInfo *)((long)pPVar12 + (ulong)bVar14 * -0x10 + 8);
    puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
  }
  subpass.inputAttachmentCount = uVar15;
  subpass._0_8_ = _colorAttachments;
  subpass._12_4_ = uVar16;
  subpass.pInputAttachments._0_4_ = uVar17;
  subpass.pInputAttachments._4_4_ = uVar18;
  subpass.colorAttachmentCount = uVar19;
  subpass._28_4_ = uVar20;
  subpass.pColorAttachments._0_4_ = uVar21;
  subpass.pColorAttachments._4_4_ = uVar22;
  subpass.pResolveAttachments._0_4_ = uVar23;
  subpass.pResolveAttachments._4_4_ = in_stack_fffffffffffff824;
  subpass.pDepthStencilAttachment = (VkAttachmentReference *)uVar24;
  subpass.preserveAttachmentCount = uVar25;
  subpass._60_4_ = in_stack_fffffffffffff834;
  subpass.pPreserveAttachments._0_4_ = uVar26;
  subpass.pPreserveAttachments._4_4_ = in_stack_fffffffffffff83c;
  Draw::RenderPassCreateInfo::addSubpass(&renderPassCreateInfo,subpass);
  Draw::SubpassDescription::~SubpassDescription((SubpassDescription *)&pipelineCreateInfo);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_798,this->m_vk,pVVar5,
             &renderPassCreateInfo.super_VkRenderPassCreateInfo,(VkAllocationCallbacks *)0x0);
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_ = local_788;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)VStack_780.m_internal;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = local_798.m_internal;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)VStack_790.m_internal;
  local_798.m_internal = 0;
  VStack_790.m_internal = 0;
  local_788 = (VkDevice)0x0;
  VStack_780.m_internal = 0;
  this_03 = &this->m_renderPass;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            (&this_03->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  (this_03->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&local_798);
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  Draw::PipelineCreateInfo::VertexInputState::VertexInputState
            ((VertexInputState *)&pipelineCreateInfo,1,&vertexInputBindingDescription,2,
             vertexInputAttributeDescriptions);
  *(ulong *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
             vertexAttributeDescriptionCount =
       CONCAT44(pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState._4_4_,
                (VkImageLayout)
                pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState);
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions
       = (VkVertexInputAttributeDescription *)
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pInputAssemblyState;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
  vertexBindingDescriptionCount = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions =
       (VkVertexInputBindingDescription *)
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
  *(undefined4 *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4 =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            (&vkCbAttachmentState,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,
             VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf
            );
  Draw::PipelineCreateInfo::PipelineCreateInfo
            (&pipelineCreateInfo,
             (VkPipelineLayout)
             (((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_730->field_0x0)->m_data).object.
             m_internal,
             (VkRenderPass)
             (this_03->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,0,0)
  ;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_798,(VkShaderModule)local_668.m_data.object.m_internal,
             "main",VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_798);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_798,(VkShaderModule)local_688.m_data.object.m_internal,
             "main",VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_798);
  local_798.m_internal =
       *(deUint64 *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo;
  VStack_790.m_internal =
       (deUint64)(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_788 = *(VkDevice *)
               &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags;
  VStack_780.m_internal =
       (deUint64)
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexBindingDescriptions;
  local_778._0_8_ =
       *(undefined8 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
         vertexAttributeDescriptionCount;
  local_778._8_8_ =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexAttributeDescriptions;
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineVertexInputStateCreateInfo *)&local_798);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_798,this->m_topology,0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineInputAssemblyStateCreateInfo *)&local_798);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)&local_798,1,
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineColorBlendStateCreateInfo *)&local_798);
  std::
  _Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::~_Vector_base(local_760);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
            ((vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *)&local_6b0,0,
             (allocator_type *)&framebufferCreateInfo);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector
            ((vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *)&local_6c8,0,
             (allocator_type *)local_7b8);
  Draw::PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)&local_798,1,
             (vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *)&local_6b0,
             (vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *)&local_6c8);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineViewportStateCreateInfo *)&local_798);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState((ViewportState *)&local_798);
  std::_Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~_Vector_base(&local_6c8);
  std::_Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~_Vector_base(&local_6b0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,
             &(this->m_depthStencilState).super_VkPipelineDepthStencilStateCreateInfo);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_798,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineRasterizationStateCreateInfo *)&local_798);
  local_7b8._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&framebufferCreateInfo,1,
             (value_type_conflict1 *)local_7b8,(allocator_type *)&attachments);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)&local_798,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&framebufferCreateInfo,false,
             false);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineMultisampleStateCreateInfo *)&local_798);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(local_778 + 0x10));
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&framebufferCreateInfo);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::vector
            ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)
             &framebufferCreateInfo,0,(allocator_type *)local_7b8);
  Draw::PipelineCreateInfo::DynamicState::DynamicState
            ((DynamicState *)&local_798,
             (vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)
             &framebufferCreateInfo);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineDynamicStateCreateInfo *)&local_798);
  std::_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~_Vector_base
            ((_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_778);
  std::_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~_Vector_base
            ((_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)
             &framebufferCreateInfo);
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&framebufferCreateInfo,this->m_vk,pVVar5,
             (VkPipelineCache)0x0,&pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo,
             (VkAllocationCallbacks *)0x0);
  local_788 = (VkDevice)framebufferCreateInfo.super_VkFramebufferCreateInfo._16_8_;
  VStack_780.m_internal = framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal;
  local_798.m_internal = framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_;
  VStack_790.m_internal = (deUint64)framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext = (void *)0x0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.flags = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._20_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_788;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_780.m_internal;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_798.m_internal;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VStack_790.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&framebufferCreateInfo);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector(&attachments,2,(allocator_type *)&local_798);
  (attachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].m_internal =
       (this_02->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            (&framebufferCreateInfo,
             (VkRenderPass)
             (this_03->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,
             &attachments,0x80,0x80,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)local_7b8,this->m_vk,pVVar5,
             &framebufferCreateInfo.super_VkFramebufferCreateInfo,(VkAllocationCallbacks *)0x0);
  local_788 = (VkDevice)local_7a8.m_internal;
  VStack_780.m_internal = VStack_7a0.m_internal;
  local_798.m_internal = (deUint64)local_7b8;
  VStack_790.m_internal = VStack_7b0.m_internal;
  local_7b8 = (undefined1  [8])0x0;
  VStack_7b0.m_internal = 0;
  local_7a8.m_internal = 0;
  VStack_7a0.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_788;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_780.m_internal;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_798.m_internal;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)VStack_790.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_7b8);
  __n = (long)(this->m_data).
              super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_data).
              super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = this->m_vk;
  Draw::BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&local_798,__n,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar9 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_7b8,pDVar1,pVVar5,(VkBufferCreateInfo *)&local_798,pAVar9,
             (MemoryRequirement)0x1);
  local_730 = pVVar5;
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&this->m_vertexBuffer,(SharedPtr<vkt::Draw::Buffer> *)local_7b8);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_7b8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_760);
  pAVar3 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_798.m_internal = (deUint64)&PTR__Allocation_00bf5e28;
  VStack_790.m_internal = (pAVar3->m_memory).m_internal;
  local_788 = (VkDevice)pAVar3->m_offset;
  __dest = (VkAllocationCallbacks *)pAVar3->m_hostPtr;
  VStack_780.m_internal = (deUint64)__dest;
  ::vk::Allocation::~Allocation((Allocation *)&local_798);
  memcpy(__dest,(this->m_data).
                super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_start,__n);
  pVVar5 = local_730;
  pBVar4 = (this->m_vertexBuffer).m_ptr;
  pAVar3 = (pBVar4->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_798.m_internal = (deUint64)&PTR__Allocation_00bf5e28;
  VStack_790.m_internal = (pAVar3->m_memory).m_internal;
  local_788 = (VkDevice)pAVar3->m_offset;
  VStack_780.m_internal = (deUint64)pAVar3->m_hostPtr;
  pAVar3 = (pBVar4->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_7b8 = (undefined1  [8])&PTR__Allocation_00bf5e28;
  VStack_7b0.m_internal = (pAVar3->m_memory).m_internal;
  local_7a8.m_internal = pAVar3->m_offset;
  VStack_7a0.m_internal = (deUint64)pAVar3->m_hostPtr;
  ::vk::flushMappedMemoryRange(this->m_vk,local_730,VStack_790,local_7a8.m_internal,__n);
  ::vk::Allocation::~Allocation((Allocation *)local_7b8);
  ::vk::Allocation::~Allocation((Allocation *)&local_798);
  _queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo(&cmdPoolCreateInfo,_queueFamilyIndex,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_7b8,this->m_vk,pVVar5,
             &cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  local_788 = (VkDevice)local_7a8.m_internal;
  VStack_780.m_internal = VStack_7a0.m_internal;
  local_798.m_internal = (deUint64)local_7b8;
  VStack_790.m_internal = VStack_7b0.m_internal;
  local_7b8 = (undefined1  [8])0x0;
  VStack_7b0.m_internal = 0;
  local_7a8.m_internal = 0;
  VStack_7a0.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_788;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_780.m_internal;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       local_798.m_internal;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VStack_790.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_7b8);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_7b8,this->m_vk,pVVar5,
             (VkCommandPool)
             (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
             m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_788 = (VkDevice)local_7a8.m_internal;
  VStack_780.m_internal = VStack_7a0.m_internal;
  local_798.m_internal = (deUint64)local_7b8;
  VStack_790.m_internal = VStack_7b0.m_internal;
  local_7b8 = (undefined1  [8])0x0;
  VStack_7b0.m_internal = 0;
  local_7a8.m_internal = 0;
  VStack_7a0.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = local_788;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       VStack_780.m_internal;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)local_798.m_internal;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VStack_790.m_internal;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_7b8);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~_Vector_base(&attachments.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               );
  Draw::PipelineCreateInfo::~PipelineCreateInfo(&pipelineCreateInfo);
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo(&renderPassCreateInfo);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&depthStencilImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&targetImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_688);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_668);
  Draw::PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo(&pipelineLayoutCreateInfo);
  return;
}

Assistant:

void initialize (void)
	{
		const vk::VkDevice device	= m_context.getDevice();

		vk::VkFormatProperties formatProperties;
		// check for VK_FORMAT_D24_UNORM_S8_UINT support
		m_context.getInstanceInterface().getPhysicalDeviceFormatProperties(m_context.getPhysicalDevice(), vk::VK_FORMAT_D24_UNORM_S8_UINT, &formatProperties);
		if (formatProperties.optimalTilingFeatures & vk::VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT)
		{
			m_depthStencilAttachmentFormat = vk::VK_FORMAT_D24_UNORM_S8_UINT;
		}
		else
		{
			// check for VK_FORMAT_D32_SFLOAT_S8_UINT support
			m_context.getInstanceInterface().getPhysicalDeviceFormatProperties(m_context.getPhysicalDevice(), vk::VK_FORMAT_D32_SFLOAT_S8_UINT, &formatProperties);
			if (formatProperties.optimalTilingFeatures & vk::VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT)
			{
				m_depthStencilAttachmentFormat = vk::VK_FORMAT_D32_SFLOAT_S8_UINT;
			}
			else
				throw tcu::NotSupportedError("No valid depth stencil attachment available");
		}

		const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
		m_pipelineLayout			= vk::createPipelineLayout(m_vk, device, &pipelineLayoutCreateInfo);

		const vk::Unique<vk::VkShaderModule> vs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
		const vk::Unique<vk::VkShaderModule> fs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

		const vk::VkExtent3D imageExtent = { WIDTH, HEIGHT, 1 };
		ImageCreateInfo targetImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, imageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
											  vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

		m_colorTargetImage = Image::createAndAlloc(m_vk, device, targetImageCreateInfo, m_context.getDefaultAllocator());

		const ImageCreateInfo depthStencilImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_depthStencilAttachmentFormat, imageExtent,
														  1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
														  vk::VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

		m_depthStencilImage = Image::createAndAlloc(m_vk, device, depthStencilImageCreateInfo, m_context.getDefaultAllocator());

		const ImageViewCreateInfo colorTargetViewInfo(m_colorTargetImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
		m_colorTargetView = vk::createImageView(m_vk, device, &colorTargetViewInfo);

		const ImageViewCreateInfo attachmentViewInfo(m_depthStencilImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_depthStencilAttachmentFormat);
		m_attachmentView = vk::createImageView(m_vk, device, &attachmentViewInfo);

		RenderPassCreateInfo renderPassCreateInfo;
		renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,
																 vk::VK_SAMPLE_COUNT_1_BIT,
																 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_IMAGE_LAYOUT_GENERAL,
																 vk::VK_IMAGE_LAYOUT_GENERAL));

		renderPassCreateInfo.addAttachment(AttachmentDescription(m_depthStencilAttachmentFormat,
																 vk::VK_SAMPLE_COUNT_1_BIT,
																 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL));

		const vk::VkAttachmentReference colorAttachmentReference =
		{
			0,
			vk::VK_IMAGE_LAYOUT_GENERAL
		};

		const vk::VkAttachmentReference depthAttachmentReference =
		{
			1,
			vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL
		};

		renderPassCreateInfo.addSubpass(SubpassDescription(vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
														   0,
														   0,
														   DE_NULL,
														   1,
														   &colorAttachmentReference,
														   DE_NULL,
														   depthAttachmentReference,
														   0,
														   DE_NULL));

		m_renderPass = vk::createRenderPass(m_vk, device, &renderPassCreateInfo);

		const vk::VkVertexInputBindingDescription vertexInputBindingDescription =
		{
			0,
			(deUint32)sizeof(tcu::Vec4) * 2,
			vk::VK_VERTEX_INPUT_RATE_VERTEX,
		};

		const vk::VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
		{
			{
				0u,
				0u,
				vk::VK_FORMAT_R32G32B32A32_SFLOAT,
				0u
			},
			{
				1u,
				0u,
				vk::VK_FORMAT_R32G32B32A32_SFLOAT,
				(deUint32)(sizeof(float)* 4),
			}
		};

		m_vertexInputState = PipelineCreateInfo::VertexInputState(1,
																  &vertexInputBindingDescription,
																  2,
																  vertexInputAttributeDescriptions);

		const PipelineCreateInfo::ColorBlendState::Attachment vkCbAttachmentState;

		PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
		pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
		pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
		pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &vkCbAttachmentState));
		pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1));
		pipelineCreateInfo.addState(m_depthStencilState);
		pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
		pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
		pipelineCreateInfo.addState(PipelineCreateInfo::DynamicState());

		m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);

		std::vector<vk::VkImageView> attachments(2);
		attachments[0] = *m_colorTargetView;
		attachments[1] = *m_attachmentView;

		const FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, attachments, WIDTH, HEIGHT, 1);

		m_framebuffer = vk::createFramebuffer(m_vk, device, &framebufferCreateInfo);

		const vk::VkDeviceSize dataSize = m_data.size() * sizeof(PositionColorVertex);
		m_vertexBuffer = Buffer::createAndAlloc(m_vk, device, BufferCreateInfo(dataSize,
			vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT),
			m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);

		deUint8* ptr = reinterpret_cast<unsigned char *>(m_vertexBuffer->getBoundMemory().getHostPtr());
		deMemcpy(ptr, &m_data[0], static_cast<size_t>(dataSize));

		vk::flushMappedMemoryRange(m_vk, device,
								   m_vertexBuffer->getBoundMemory().getMemory(),
								   m_vertexBuffer->getBoundMemory().getOffset(),
								   dataSize);

		const CmdPoolCreateInfo cmdPoolCreateInfo(m_context.getUniversalQueueFamilyIndex());
		m_cmdPool = vk::createCommandPool(m_vk, device, &cmdPoolCreateInfo);
		m_cmdBuffer = vk::allocateCommandBuffer(m_vk, device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY);
	}